

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minSelect(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *val,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *stab,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *bestDelta,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *max,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *update,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *lowBound,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *upBound,int start,int incr)

{
  Type TVar1;
  int iVar2;
  uint uVar3;
  pointer pnVar4;
  pointer pnVar5;
  int *piVar6;
  pointer pnVar7;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar8;
  SPxId *pSVar9;
  type_conflict5 tVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *pDVar14;
  pointer pnVar15;
  ulong uVar16;
  pointer pnVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  uint *puVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar21;
  uint *puVar22;
  uint *puVar23;
  bool bVar24;
  byte bVar25;
  uint local_2b8;
  uint local_2b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  
  bVar25 = 0;
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 0x1c;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems[0xe] = 0;
  local_138.data._M_elems[0xf] = 0;
  local_138.data._M_elems[0x10] = 0;
  local_138.data._M_elems[0x11] = 0;
  local_138.data._M_elems[0x12] = 0;
  local_138.data._M_elems[0x13] = 0;
  local_138.data._M_elems[0x14] = 0;
  local_138.data._M_elems[0x15] = 0;
  local_138.data._M_elems[0x16] = 0;
  local_138.data._M_elems[0x17] = 0;
  local_138.data._M_elems[0x18] = 0;
  local_138.data._M_elems[0x19] = 0;
  local_138.data._M_elems._104_5_ = 0;
  local_138.data._M_elems[0x1b]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  local_1b8.m_backend.fpclass = cpp_dec_float_finite;
  local_1b8.m_backend.prec_elem = 0x1c;
  local_1b8.m_backend.data._M_elems[0] = 0;
  local_1b8.m_backend.data._M_elems[1] = 0;
  local_1b8.m_backend.data._M_elems[2] = 0;
  local_1b8.m_backend.data._M_elems[3] = 0;
  local_1b8.m_backend.data._M_elems[4] = 0;
  local_1b8.m_backend.data._M_elems[5] = 0;
  local_1b8.m_backend.data._M_elems[6] = 0;
  local_1b8.m_backend.data._M_elems[7] = 0;
  local_1b8.m_backend.data._M_elems[8] = 0;
  local_1b8.m_backend.data._M_elems[9] = 0;
  local_1b8.m_backend.data._M_elems[10] = 0;
  local_1b8.m_backend.data._M_elems[0xb] = 0;
  local_1b8.m_backend.data._M_elems[0xc] = 0;
  local_1b8.m_backend.data._M_elems[0xd] = 0;
  local_1b8.m_backend.data._M_elems[0xe] = 0;
  local_1b8.m_backend.data._M_elems[0xf] = 0;
  local_1b8.m_backend.data._M_elems[0x18] = 0;
  local_1b8.m_backend.data._M_elems[0x19] = 0;
  local_1b8.m_backend.data._M_elems._104_5_ = 0;
  local_1b8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_1b8.m_backend.exp = 0;
  local_1b8.m_backend.neg = false;
  local_1b8.m_backend.data._M_elems[0x10] = 0;
  local_1b8.m_backend.data._M_elems[0x11] = 0;
  local_1b8.m_backend.data._M_elems[0x12] = 0;
  local_1b8.m_backend.data._M_elems[0x13] = 0;
  local_1b8.m_backend.data._M_elems[0x14] = 0;
  local_1b8.m_backend.data._M_elems[0x15] = 0;
  local_1b8.m_backend.data._M_elems[0x16] = 0;
  local_1b8.m_backend.data._M_elems[0x17] = 0;
  TVar1 = (this->
          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_type;
  if (TVar1 == LEAVE) {
    bVar24 = false;
  }
  else {
    bVar24 = ((this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->theRep == ROW;
  }
  pnVar4 = (upBound->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar15 = (lowBound->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pnVar5 = (update->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar6 = (update->thedelta).super_IdxSet.idx;
  pnVar7 = (update->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar2 = (update->thedelta).super_IdxSet.num;
  puVar23 = (uint *)(piVar6 + start);
  lVar13 = 0x1c;
  local_2b8 = 0xffffffff;
  local_2b4 = local_2b8;
  do {
    if (piVar6 + iVar2 <= puVar23) {
      if (0 < (int)local_2b8 && (int)local_2b4 < 0) {
        uVar16 = (ulong)local_2b8;
        result_1.m_backend.data._M_elems._0_8_ =
             result_1.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar10 = boost::multiprecision::operator<(pnVar7 + uVar16,(int *)&result_1);
        if (tVar10) {
          pnVar15 = pnVar5;
          pnVar5 = pnVar4;
        }
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems[0x18] = 0;
        result_1.m_backend.data._M_elems[0x19] = 0;
        result_1.m_backend.data._M_elems._104_5_ = 0;
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_1.m_backend,&pnVar5[uVar16].m_backend,&pnVar15[uVar16].m_backend);
        pcVar18 = &result_1.m_backend;
        pnVar19 = bestDelta;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pnVar19->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar25 * -8 + 4);
          pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar19 + ((ulong)bVar25 * -2 + 1) * 4);
        }
        (bestDelta->m_backend).exp = result_1.m_backend.exp;
        (bestDelta->m_backend).neg = result_1.m_backend.neg;
        (bestDelta->m_backend).fpclass = result_1.m_backend.fpclass;
        (bestDelta->m_backend).prec_elem = result_1.m_backend.prec_elem;
      }
      return local_2b4;
    }
    uVar3 = *puVar23;
    pnVar17 = pnVar7 + (int)uVar3;
    pcVar18 = &local_138;
    for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pcVar18->data)._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
      pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar25 * -2 + 1) * 4);
      pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar25 * -8 + 4);
    }
    local_138.exp = pnVar7[(int)uVar3].m_backend.exp;
    local_138.neg = pnVar7[(int)uVar3].m_backend.neg;
    local_138.fpclass = pnVar7[(int)uVar3].m_backend.fpclass;
    local_138.prec_elem = pnVar7[(int)uVar3].m_backend.prec_elem;
    if (TVar1 == LEAVE) {
      pSVar8 = (this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      if (this->iscoid == true) {
        pDVar14 = (pSVar8->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.costat;
      }
      else {
        pDVar14 = (pSVar8->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.stat;
      }
      if (pSVar8->theRep * pDVar14->data[(int)uVar3] < 1) goto LAB_00453721;
    }
    else {
LAB_00453721:
      if (bVar24) {
        pSVar8 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        pSVar9 = (pSVar8->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).theBaseId.data;
        if (0 < pSVar9[(int)uVar3].super_DataKey.info) {
          SPxColId::SPxColId((SPxColId *)&result_1,pSVar9 + (int)uVar3);
          iVar11 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                   ::number(&(pSVar8->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set,(DataKey *)&result_1);
          if ((pSVar8->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data[iVar11] == P_FIXED) goto LAB_00453bbb;
        }
      }
      tVar10 = boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_138,stab);
      if (tVar10) {
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems[0xe] = 0;
        result.m_backend.data._M_elems[0xf] = 0;
        result.m_backend.data._M_elems[0x10] = 0;
        result.m_backend.data._M_elems[0x11] = 0;
        result.m_backend.data._M_elems[0x12] = 0;
        result.m_backend.data._M_elems[0x13] = 0;
        result.m_backend.data._M_elems[0x14] = 0;
        result.m_backend.data._M_elems[0x15] = 0;
        result.m_backend.data._M_elems[0x16] = 0;
        result.m_backend.data._M_elems[0x17] = 0;
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result.m_backend,&pnVar15[(int)uVar3].m_backend,&pnVar5[(int)uVar3].m_backend);
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems[0x18] = 0;
        result_1.m_backend.data._M_elems[0x19] = 0;
        result_1.m_backend.data._M_elems._104_5_ = 0;
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_1.m_backend,&result.m_backend,&local_138);
        pnVar19 = &local_1b8;
        pcVar18 = &result_1.m_backend;
        pnVar21 = pnVar19;
        for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pnVar21->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar25 * -8 + 4);
          pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar21 + ((ulong)bVar25 * -2 + 1) * 4);
        }
        local_1b8.m_backend.exp = result_1.m_backend.exp;
        local_1b8.m_backend.neg = result_1.m_backend.neg;
        local_1b8.m_backend.fpclass = result_1.m_backend.fpclass;
        local_1b8.m_backend.prec_elem = result_1.m_backend.prec_elem;
        tVar10 = boost::multiprecision::operator>=(pnVar19,max);
        lVar12 = lVar13;
        pnVar21 = val;
        if (tVar10) {
          for (; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pnVar21->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
            pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar19 + ((ulong)bVar25 * -2 + 1) * 4);
            pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar21 + ((ulong)bVar25 * -2 + 1) * 4);
          }
          (val->m_backend).exp = local_1b8.m_backend.exp;
          (val->m_backend).neg = local_1b8.m_backend.neg;
          (val->m_backend).fpclass = local_1b8.m_backend.fpclass;
          (val->m_backend).prec_elem = local_1b8.m_backend.prec_elem;
          pcVar18 = &local_138;
          pnVar19 = stab;
          for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pnVar19->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar25 * -8 + 4);
            pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar19 + ((ulong)bVar25 * -2 + 1) * 4);
          }
          (stab->m_backend).exp = local_138.exp;
          (stab->m_backend).neg = local_138.neg;
          (stab->m_backend).fpclass = local_138.fpclass;
          (stab->m_backend).prec_elem = local_138.prec_elem;
          local_2b4 = uVar3;
        }
        else {
LAB_00453b63:
          pnVar19 = &local_1b8;
          tVar10 = boost::multiprecision::operator<(pnVar19,best);
          lVar12 = lVar13;
          pnVar21 = best;
          if (tVar10) {
            for (; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar21->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
              pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar19 + ((ulong)bVar25 * -2 + 1) * 4);
              pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar21 + ((ulong)bVar25 * -2 + 1) * 4);
            }
            (best->m_backend).exp = local_1b8.m_backend.exp;
            (best->m_backend).neg = local_1b8.m_backend.neg;
            (best->m_backend).fpclass = local_1b8.m_backend.fpclass;
            (best->m_backend).prec_elem = local_1b8.m_backend.prec_elem;
            local_2b8 = uVar3;
          }
        }
      }
      else {
        pnVar19 = stab;
        pcVar18 = &result_1.m_backend;
        for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pcVar18->data)._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
          pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar19 + ((ulong)bVar25 * -2 + 1) * 4);
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar25 * -8 + 4);
        }
        result_1.m_backend.exp = (stab->m_backend).exp;
        result_1.m_backend.neg = (stab->m_backend).neg;
        result_1.m_backend.fpclass = (stab->m_backend).fpclass;
        result_1.m_backend.prec_elem = (stab->m_backend).prec_elem;
        if (result_1.m_backend.fpclass != cpp_dec_float_finite ||
            result_1.m_backend.data._M_elems[0] != 0) {
          result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
        }
        tVar10 = boost::multiprecision::operator<
                           ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_138,
                            (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&result_1.m_backend);
        if (tVar10) {
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x1c;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems[0xe] = 0;
          result.m_backend.data._M_elems[0xf] = 0;
          result.m_backend.data._M_elems[0x10] = 0;
          result.m_backend.data._M_elems[0x11] = 0;
          result.m_backend.data._M_elems[0x12] = 0;
          result.m_backend.data._M_elems[0x13] = 0;
          result.m_backend.data._M_elems[0x14] = 0;
          result.m_backend.data._M_elems[0x15] = 0;
          result.m_backend.data._M_elems[0x16] = 0;
          result.m_backend.data._M_elems[0x17] = 0;
          result.m_backend.data._M_elems[0x18] = 0;
          result.m_backend.data._M_elems[0x19] = 0;
          result.m_backend.data._M_elems._104_5_ = 0;
          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result.m_backend,&pnVar4[(int)uVar3].m_backend,&pnVar5[(int)uVar3].m_backend);
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,&result.m_backend,&local_138);
          pnVar19 = &local_1b8;
          pcVar18 = &result_1.m_backend;
          pnVar21 = pnVar19;
          for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pnVar21->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar25 * -8 + 4);
            pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar21 + ((ulong)bVar25 * -2 + 1) * 4);
          }
          local_1b8.m_backend.exp = result_1.m_backend.exp;
          local_1b8.m_backend.neg = result_1.m_backend.neg;
          local_1b8.m_backend.fpclass = result_1.m_backend.fpclass;
          local_1b8.m_backend.prec_elem = result_1.m_backend.prec_elem;
          tVar10 = boost::multiprecision::operator>=(pnVar19,max);
          lVar12 = lVar13;
          pnVar21 = val;
          if (!tVar10) goto LAB_00453b63;
          for (; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pnVar21->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
            pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar19 + ((ulong)bVar25 * -2 + 1) * 4);
            pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar21 + ((ulong)bVar25 * -2 + 1) * 4);
          }
          (val->m_backend).exp = local_1b8.m_backend.exp;
          (val->m_backend).neg = local_1b8.m_backend.neg;
          (val->m_backend).fpclass = local_1b8.m_backend.fpclass;
          (val->m_backend).prec_elem = local_1b8.m_backend.prec_elem;
          (stab->m_backend).data._M_elems[0] = local_138.data._M_elems[0];
          puVar20 = local_138.data._M_elems + 1;
          puVar22 = (stab->m_backend).data._M_elems + 1;
          for (lVar12 = 0x1b; lVar12 != 0; lVar12 = lVar12 + -1) {
            *puVar22 = *puVar20;
            puVar20 = puVar20 + (ulong)bVar25 * -2 + 1;
            puVar22 = puVar22 + (ulong)bVar25 * -2 + 1;
          }
          (stab->m_backend).exp = local_138.exp;
          (stab->m_backend).neg =
               (bool)((local_138.data._M_elems[0] != 0 || local_138.fpclass != cpp_dec_float_finite)
                     ^ local_138.neg);
          (stab->m_backend).fpclass = local_138.fpclass;
          (stab->m_backend).prec_elem = local_138.prec_elem;
          local_2b4 = uVar3;
        }
      }
    }
LAB_00453bbb:
    puVar23 = puVar23 + incr;
  } while( true );
}

Assistant:

int SPxFastRT<R>::minSelect(
   R& val,
   R& stab,
   R& best,
   R& bestDelta,
   R max,
   const UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i;
   R x, y;
   bool leaving = this->m_type == SPxSolverBase<R>::LEAVE;
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();
   const int* last = idx + update.delta().size();

   int nr = -1;
   int bestNr = -1;

   for(idx += start; idx < last; idx += incr)
   {
      i = *idx;
      x = upd[i];

      // in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables
      if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                     && this->thesolver->isBasic(i))))
         continue;

      if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
            && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
            == SPxBasisBase<R>::Desc::P_FIXED)
         continue;

      if(x > stab)
      {
         y = (low[i] - vec[i]) / x;

         if(y >= max)
         {
            val = y;
            nr = i;
            stab = x;
         }
         else if(y < best)
         {
            best = y;
            bestNr = i;
         }
      }
      else if(x < -stab)
      {
         y = (up[i] - vec[i]) / x;

         if(y >= max)
         {
            val = y;
            nr = i;
            stab = -x;
         }
         else if(y < best)
         {
            best = y;
            bestNr = i;
         }
      }
   }

   if(nr < 0 && bestNr > 0)
   {
      if(upd[bestNr] < 0)
         bestDelta = up[bestNr] - vec[bestNr];
      else
         bestDelta = vec[bestNr] - low[bestNr];
   }

   return nr;
}